

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O0

void __thiscall Txid_TxidFromHexError_Test::TestBody(Txid_TxidFromHexError_Test *this)

{
  bool bVar1;
  AssertHelper local_90;
  Message local_88 [2];
  CfdException *anon_var_0;
  string local_70 [32];
  undefined1 local_50 [8];
  Txid txid;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Txid_TxidFromHexError_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_70,"123456789012345678901234567890123456789012345678901234567890123412",
                 (allocator *)((long)&anon_var_0 + 7));
      cfd::core::Txid::Txid((Txid *)local_50,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      cfd::core::Txid::~Txid((Txid *)local_50);
    }
    pcStack_18 = 
    "Expected: Txid txid = Txid( \"123456789012345678901234567890123456789012345678901234567890123412\") throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_88);
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txid.cpp"
             ,0x2d,pcStack_18);
  testing::internal::AssertHelper::operator=(&local_90,local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  testing::Message::~Message(local_88);
  return;
}

Assistant:

TEST(Txid, TxidFromHexError) {
  EXPECT_THROW(
      Txid txid = Txid( "123456789012345678901234567890123456789012345678901234567890123412"),
      CfdException);
}